

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomentumHistogram.cpp
# Opt level: O0

void __thiscall
OpenMD::MomentumHistogram::MomentumHistogram
          (MomentumHistogram *this,SimInfo *info,string *filename,string *sele,int nbins,
          int momentum_type,int momentum_component)

{
  undefined1 uVar1;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  SimInfo *in_stack_00000018;
  SelectionEvaluator *in_stack_00000020;
  SimInfo *in_stack_000001c8;
  SelectionManager *in_stack_000001d0;
  int iVar2;
  uint in_stack_ffffffffffffff1c;
  int iVar3;
  StaticAnalyser *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  StaticAnalyser *in_stack_ffffffffffffff30;
  SelectionManager *this_00;
  SelectionEvaluator *this_01;
  string *script;
  SelectionEvaluator *in_stack_ffffffffffffff70;
  string local_70 [72];
  undefined4 local_28;
  undefined4 local_24;
  string *local_20;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff30,
             (SimInfo *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  *in_RDI = &PTR__MomentumHistogram_00560728;
  script = (string *)(in_RDI + 0x1b);
  std::__cxx11::string::string((string *)script,local_20);
  this_01 = (SelectionEvaluator *)(in_RDI + 0x1f);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  *(undefined4 *)(in_RDI + 0xe2) = local_24;
  *(undefined4 *)((long)in_RDI + 0x714) = local_28;
  this_00 = (SelectionManager *)(in_RDI + 0xe3);
  std::__cxx11::string::string((string *)this_00);
  *(undefined4 *)(in_RDI + 0xe7) = in_stack_00000008;
  std::__cxx11::string::string((string *)(in_RDI + 0xe8));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1f9c7a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1f9c90);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff70,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_ffffffffffffff20 = (StaticAnalyser *)(in_RDI + 0xc9);
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
    SelectionSet::~SelectionSet((SelectionSet *)0x1f9d1a);
  }
  iVar3 = *(int *)((long)in_RDI + 0x714);
  if ((iVar3 == 0) || (iVar3 != 1)) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe3),"Linear Momentum: P");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe3),"Angular Momentum: J");
  }
  iVar2 = *(int *)(in_RDI + 0xe7);
  if (iVar2 == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"x");
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"y");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"z");
  }
  getPrefix((string *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff28),(char *)in_stack_ffffffffffffff20);
  StaticAnalyser::setOutputName(in_stack_ffffffffffffff20,(string *)CONCAT44(iVar3,iVar2));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  return;
}

Assistant:

MomentumHistogram::MomentumHistogram(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& sele, int nbins,
                                       int momentum_type,
                                       int momentum_component) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), nBins_(nbins),
      mom_type_(momentum_type), mom_comp_(momentum_component) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    switch (mom_type_) {
    case 1:
      momentumLabel_ = "Angular Momentum: J";
      break;
    case 0:
    default:
      momentumLabel_ = "Linear Momentum: P";
      break;
    }

    switch (mom_comp_) {
    case 0:
      componentLabel_ = "x";
      break;
    case 1:
      componentLabel_ = "y";
      break;
    case 2:
    default:
      componentLabel_ = "z";
      break;
    }

    setOutputName(getPrefix(filename) + ".MomentumHistogram");
  }